

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMacroCommand.cxx
# Opt level: O1

bool __thiscall
cmMacroFunctionBlocker::IsFunctionBlocked
          (cmMacroFunctionBlocker *this,cmListFileFunction *lff,cmMakefile *mf,
          cmExecutionStatus *param_3)

{
  int iVar1;
  cmCommand *command;
  cmState *pcVar2;
  string newName;
  undefined1 local_58 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  iVar1 = cmsys::SystemTools::Strucmp((lff->super_cmListFileContext).Name._M_dataplus._M_p,"macro");
  if (iVar1 == 0) {
    this->Depth = this->Depth + 1;
  }
  else {
    iVar1 = cmsys::SystemTools::Strucmp
                      ((lff->super_cmListFileContext).Name._M_dataplus._M_p,"endmacro");
    if (iVar1 == 0) {
      if (this->Depth == 0) {
        cmMakefile::AddMacro
                  (mf,(((this->Args).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p);
        command = (cmCommand *)operator_new(200);
        (command->Helper).Arguments.
        super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (command->Helper).Arguments.
        super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (command->Helper).Arguments.
        super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (command->Error)._M_dataplus._M_p = (pointer)&(command->Error).field_2;
        (command->Error)._M_string_length = 0;
        (command->Error).field_2._M_local_buf[0] = '\0';
        command->Makefile = (cmMakefile *)0x0;
        command->Enabled = true;
        (command->super_cmObject)._vptr_cmObject = (_func_int **)&PTR__cmMacroHelperCommand_005b2d20
        ;
        command[1].super_cmObject._vptr_cmObject = (_func_int **)0x0;
        command[1].Makefile = (cmMakefile *)0x0;
        command[1].Helper.Arguments.
        super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        command[1].Helper.Arguments.
        super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        command[1].Helper.Arguments.
        super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        *(undefined8 *)&command[1].Enabled = 0;
        command[1].Error._M_dataplus._M_p = (pointer)0x0;
        command[1].Error._M_string_length = 0;
        command[1].Error.field_2._M_allocated_capacity = 0;
        *(undefined8 *)((long)&command[1].Error.field_2 + 8) = 0;
        command[2].super_cmObject._vptr_cmObject = (_func_int **)0x0;
        command[2].Makefile =
             (cmMakefile *)
             &command[2].Helper.Arguments.
              super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
        command[2].Helper.Arguments.
        super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        *(undefined1 *)
         &command[2].Helper.Arguments.
          super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
          super__Vector_impl_data._M_finish = 0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(command + 1),&this->Args);
        std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::operator=
                  ((vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *)
                   &command[1].Helper.Arguments.
                    super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish,&this->Functions);
        std::__cxx11::string::_M_assign((string *)&command[2].Makefile);
        cmMakefile::RecordPolicies(mf,(PolicyMap *)&command[1].Error);
        std::operator+(&local_50,"_",
                       (this->Args).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start);
        pcVar2 = cmMakefile::GetState(mf);
        cmState::RenameCommand
                  (pcVar2,(this->Args).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,&local_50);
        pcVar2 = cmMakefile::GetState(mf);
        cmState::AddCommand(pcVar2,command);
        cmMakefile::RemoveFunctionBlocker
                  ((cmMakefile *)local_58,(cmFunctionBlocker *)mf,(cmListFileFunction *)this);
        if (local_58 != (undefined1  [8])0x0) {
          (*(code *)*(_List_node_base **)
                     ((long)((((list<cmDefinitions,_std::allocator<cmDefinitions>_> *)local_58)->
                             super__List_base<cmDefinitions,_std::allocator<cmDefinitions>_>).
                             _M_impl._M_node.super__List_node_base._M_next + 1) + 8))();
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p == &local_50.field_2) {
          return true;
        }
        operator_delete(local_50._M_dataplus._M_p,
                        (ulong)(local_50.field_2._M_allocated_capacity + 1));
        return true;
      }
      this->Depth = this->Depth + -1;
    }
  }
  std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::push_back
            (&this->Functions,lff);
  return true;
}

Assistant:

bool cmMacroFunctionBlocker::
IsFunctionBlocked(const cmListFileFunction& lff, cmMakefile &mf,
                  cmExecutionStatus &)
{
  // record commands until we hit the ENDMACRO
  // at the ENDMACRO call we shift gears and start looking for invocations
  if(!cmSystemTools::Strucmp(lff.Name.c_str(),"macro"))
    {
    this->Depth++;
    }
  else if(!cmSystemTools::Strucmp(lff.Name.c_str(),"endmacro"))
    {
    // if this is the endmacro for this macro then execute
    if (!this->Depth)
      {
      mf.AddMacro(this->Args[0].c_str());
      // create a new command and add it to cmake
      cmMacroHelperCommand *f = new cmMacroHelperCommand();
      f->Args = this->Args;
      f->Functions = this->Functions;
      f->FilePath = this->GetStartingContext().FilePath;
      mf.RecordPolicies(f->Policies);
      std::string newName = "_" + this->Args[0];
      mf.GetState()->RenameCommand(this->Args[0], newName);
      mf.GetState()->AddCommand(f);

      // remove the function blocker now that the macro is defined
      mf.RemoveFunctionBlocker(this, lff);
      return true;
      }
    else
      {
      // decrement for each nested macro that ends
      this->Depth--;
      }
    }

  // if it wasn't an endmacro and we are not executing then we must be
  // recording
  this->Functions.push_back(lff);
  return true;
}